

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O0

char * yajl_status_to_string(yajl_status stat)

{
  char *statStr;
  yajl_status stat_local;
  
  statStr = "unknown";
  if (stat == yajl_status_ok) {
    statStr = "ok, no error";
  }
  else if (stat == yajl_status_client_canceled) {
    statStr = "client canceled parse";
  }
  else if (stat == yajl_status_error) {
    statStr = "parse error";
  }
  return statStr;
}

Assistant:

const char *
yajl_status_to_string(yajl_status stat)
{
    const char * statStr = "unknown";
    switch (stat) {
        case yajl_status_ok:
            statStr = "ok, no error";
            break;
        case yajl_status_client_canceled:
            statStr = "client canceled parse";
            break;
        case yajl_status_error:
            statStr = "parse error";
            break;
        default:
            break;
    }
    return statStr;
}